

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderTextureFunctionCase::init
          (ShaderTextureFunctionCase *this,EVP_PKEY_CTX *ctx)

{
  tcu *this_00;
  Vector<float,_4> *this_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this_02;
  float *pfVar3;
  Vec4 *b_00;
  EVP_PKEY_CTX *ctx_00;
  float fVar4;
  Matrix<float,_4,_4> local_188;
  undefined1 auStack_148 [8];
  float lodCoordTrans [16];
  float b_1;
  float s_1;
  float local_b8 [2];
  float baseCoordTrans [16];
  Vec4 b;
  Vec4 s;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  long lStack_18;
  int numVertexUnits;
  Functions *gl;
  ShaderTextureFunctionCase *this_local;
  
  gl = (Functions *)this;
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
    iVar2 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
    lStack_18 = CONCAT44(extraout_var,iVar2);
    local_1c = 0;
    (**(code **)(lStack_18 + 0x868))(0x8b4c,&local_1c);
    if (local_1c < 1) {
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Vertex shader texture access is not supported",&local_41);
      tcu::NotSupportedError::NotSupportedError(this_02,&local_40);
      __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  b_00 = &(this->m_lookupSpec).minCoord;
  this_00 = (tcu *)(b.m_data + 2);
  tcu::operator-(this_00,&(this->m_lookupSpec).maxCoord,b_00);
  this_01 = (Vector<float,_4> *)(baseCoordTrans + 0xe);
  tcu::Vector<float,_4>::Vector(this_01,b_00);
  pfVar3 = tcu::Vector<float,_4>::x((Vector<float,_4> *)this_00);
  local_b8[0] = *pfVar3;
  local_b8[1] = 0.0;
  baseCoordTrans[0] = 0.0;
  pfVar3 = tcu::Vector<float,_4>::x(this_01);
  baseCoordTrans[1] = *pfVar3;
  baseCoordTrans[2] = 0.0;
  pfVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)this_00);
  baseCoordTrans[3] = *pfVar3;
  baseCoordTrans[4] = 0.0;
  pfVar3 = tcu::Vector<float,_4>::y(this_01);
  baseCoordTrans[5] = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::z((Vector<float,_4> *)this_00);
  baseCoordTrans[6] = *pfVar3 * 0.5;
  pfVar3 = tcu::Vector<float,_4>::z((Vector<float,_4> *)this_00);
  baseCoordTrans[7] = -*pfVar3 * 0.5;
  baseCoordTrans[8] = 0.0;
  pfVar3 = tcu::Vector<float,_4>::z((Vector<float,_4> *)this_00);
  fVar4 = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::z(this_01);
  baseCoordTrans[9] = fVar4 * 0.5 + *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::w((Vector<float,_4> *)this_00);
  baseCoordTrans[10] = -*pfVar3 * 0.5;
  pfVar3 = tcu::Vector<float,_4>::w((Vector<float,_4> *)this_00);
  baseCoordTrans[0xb] = *pfVar3 * 0.5;
  baseCoordTrans[0xc] = 0.0;
  pfVar3 = tcu::Vector<float,_4>::w((Vector<float,_4> *)this_00);
  fVar4 = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::w(this_01);
  baseCoordTrans[0xd] = fVar4 * 0.5 + *pfVar3;
  ctx_00 = (EVP_PKEY_CTX *)&b_1;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)ctx_00,local_b8);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
            (&(this->super_ShaderRenderCase).m_userAttribTransforms,(value_type *)ctx_00);
  tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)&b_1);
  bVar1 = anon_unknown_1::functionHasLod((this->m_lookupSpec).function);
  if ((bVar1) || (((this->m_lookupSpec).useBias & 1U) != 0)) {
    fVar4 = (this->m_lookupSpec).maxLodBias - (this->m_lookupSpec).minLodBias;
    lodCoordTrans._8_16_ = ZEXT416(0);
    auStack_148._4_4_ = fVar4 * 0.5;
    auStack_148._0_4_ = fVar4 * 0.5;
    lodCoordTrans[0] = 0.0;
    lodCoordTrans[1] = (this->m_lookupSpec).minLodBias;
    ctx_00 = (EVP_PKEY_CTX *)&local_188;
    lodCoordTrans._24_16_ = lodCoordTrans._8_16_;
    lodCoordTrans._40_16_ = lodCoordTrans._8_16_;
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)ctx_00,(float *)auStack_148);
    std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
              (&(this->super_ShaderRenderCase).m_userAttribTransforms,(value_type *)ctx_00);
    tcu::Matrix<float,_4,_4>::~Matrix(&local_188);
  }
  initShaderSources(this);
  initTexture(this);
  iVar2 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx_00);
  return iVar2;
}

Assistant:

void ShaderTextureFunctionCase::init (void)
{
	if (m_isVertexCase)
	{
		const glw::Functions& gl = m_renderCtx.getFunctions();
		int numVertexUnits = 0;
		gl.getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &numVertexUnits);
		if (numVertexUnits < 1)
			throw tcu::NotSupportedError("Vertex shader texture access is not supported");
	}

	{
		// Base coord scale & bias
		Vec4 s = m_lookupSpec.maxCoord-m_lookupSpec.minCoord;
		Vec4 b = m_lookupSpec.minCoord;

		float baseCoordTrans[] =
		{
			s.x(),		0.0f,		0.f,	b.x(),
			0.f,		s.y(),		0.f,	b.y(),
			s.z()/2.f,	-s.z()/2.f,	0.f,	s.z()/2.f + b.z(),
			-s.w()/2.f,	s.w()/2.f,	0.f,	s.w()/2.f + b.w()
		};

		m_userAttribTransforms.push_back(tcu::Mat4(baseCoordTrans));
	}

	if (functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias)
	{
		float s = m_lookupSpec.maxLodBias-m_lookupSpec.minLodBias;
		float b = m_lookupSpec.minLodBias;
		float lodCoordTrans[] =
		{
			s/2.0f,		s/2.0f,		0.f,	b,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(lodCoordTrans));
	}

	initShaderSources();
	initTexture();

	gls::ShaderRenderCase::init();
}